

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O2

llb_build_key_t * llb_build_key_make_custom_task_with_data(char *name,llb_data_t data)

{
  CAPIBuildKey *this;
  size_t sVar1;
  StringRef taskData;
  StringRef name_00;
  BuildKey BStack_48;
  
  this = (CAPIBuildKey *)operator_new(0x38);
  if (name == (char *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = strlen(name);
  }
  taskData.Length = data.length;
  taskData.Data = (char *)data.data;
  name_00.Length = sVar1;
  name_00.Data = name;
  llbuild::buildsystem::BuildKey::makeCustomTask(&BStack_48,name_00,taskData);
  anon_unknown.dwarf_243886::CAPIBuildKey::CAPIBuildKey(this,&BStack_48);
  std::__cxx11::string::_M_dispose();
  return (llb_build_key_t *)this;
}

Assistant:

llb_build_key_t *llb_build_key_make_custom_task_with_data(const char *name, llb_data_t data) {
  return (llb_build_key_t *)new CAPIBuildKey(BuildKey::makeCustomTask(StringRef(name), StringRef((const char *)data.data, data.length)));
}